

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O1

bool __thiscall ZAP::Archive::openMemory(Archive *this,char *data,size_t size)

{
  bool bVar1;
  istringstream *this_00;
  long *local_48 [2];
  long local_38 [2];
  
  this_00 = (istringstream *)operator_new(0x180);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,data,data + size);
  std::__cxx11::istringstream::istringstream(this_00,(string *)local_48,_S_in|_S_bin);
  this->stream = (istream *)this_00;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  bVar1 = loadStream(this);
  return bVar1;
}

Assistant:

bool Archive::openMemory(const char *data, std::size_t size)
	{
		stream = new std::istringstream(std::string(data, size), std::ios::in | std::ios::binary);
		return loadStream();
	}